

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec256.c
# Opt level: O0

void chacha20_core_256(Lib_IntVector_Intrinsics_vec256 *k,Lib_IntVector_Intrinsics_vec256 *ctx,
                      uint32_t ctr)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  int in_EDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Lib_IntVector_Intrinsics_vec256 x_15;
  Lib_IntVector_Intrinsics_vec256 *os_15;
  Lib_IntVector_Intrinsics_vec256 x_14;
  Lib_IntVector_Intrinsics_vec256 *os_14;
  Lib_IntVector_Intrinsics_vec256 x_13;
  Lib_IntVector_Intrinsics_vec256 *os_13;
  Lib_IntVector_Intrinsics_vec256 x_12;
  Lib_IntVector_Intrinsics_vec256 *os_12;
  Lib_IntVector_Intrinsics_vec256 x_11;
  Lib_IntVector_Intrinsics_vec256 *os_11;
  Lib_IntVector_Intrinsics_vec256 x_10;
  Lib_IntVector_Intrinsics_vec256 *os_10;
  Lib_IntVector_Intrinsics_vec256 x_9;
  Lib_IntVector_Intrinsics_vec256 *os_9;
  Lib_IntVector_Intrinsics_vec256 x_8;
  Lib_IntVector_Intrinsics_vec256 *os_8;
  Lib_IntVector_Intrinsics_vec256 x_7;
  Lib_IntVector_Intrinsics_vec256 *os_7;
  Lib_IntVector_Intrinsics_vec256 x_6;
  Lib_IntVector_Intrinsics_vec256 *os_6;
  Lib_IntVector_Intrinsics_vec256 x_5;
  Lib_IntVector_Intrinsics_vec256 *os_5;
  Lib_IntVector_Intrinsics_vec256 x_4;
  Lib_IntVector_Intrinsics_vec256 *os_4;
  Lib_IntVector_Intrinsics_vec256 x_3;
  Lib_IntVector_Intrinsics_vec256 *os_3;
  Lib_IntVector_Intrinsics_vec256 x_2;
  Lib_IntVector_Intrinsics_vec256 *os_2;
  Lib_IntVector_Intrinsics_vec256 x_1;
  Lib_IntVector_Intrinsics_vec256 *os_1;
  Lib_IntVector_Intrinsics_vec256 x;
  Lib_IntVector_Intrinsics_vec256 *os;
  uint32_t i;
  Lib_IntVector_Intrinsics_vec256 cv;
  uint32_t ctr_u32;
  undefined8 local_940;
  undefined8 uStackY_938;
  undefined8 uStackY_930;
  undefined8 uStackY_928;
  undefined8 local_900;
  undefined8 uStackY_8f8;
  undefined8 uStackY_8f0;
  undefined8 uStackY_8e8;
  undefined8 local_8c0;
  undefined8 uStackY_8b8;
  undefined8 uStackY_8b0;
  undefined8 uStackY_8a8;
  undefined8 local_880;
  undefined8 uStackY_878;
  undefined8 uStackY_870;
  undefined8 uStackY_868;
  undefined8 local_840;
  undefined8 uStackY_838;
  undefined8 uStackY_830;
  undefined8 uStackY_828;
  undefined8 local_800;
  undefined8 uStackY_7f8;
  undefined8 uStackY_7f0;
  undefined8 uStackY_7e8;
  undefined8 local_7c0;
  undefined8 uStackY_7b8;
  undefined8 uStackY_7b0;
  undefined8 uStackY_7a8;
  undefined8 local_780;
  undefined8 uStackY_778;
  undefined8 uStackY_770;
  undefined8 uStackY_768;
  undefined8 local_740;
  undefined8 uStackY_738;
  undefined8 uStackY_730;
  undefined8 uStackY_728;
  undefined8 local_700;
  undefined8 uStackY_6f8;
  undefined8 uStackY_6f0;
  undefined8 uStackY_6e8;
  undefined8 local_6c0;
  undefined8 uStackY_6b8;
  undefined8 uStackY_6b0;
  undefined8 uStackY_6a8;
  undefined8 local_680;
  undefined8 uStackY_678;
  undefined8 uStackY_670;
  undefined8 uStackY_668;
  undefined8 local_640;
  undefined8 uStackY_638;
  undefined8 uStackY_630;
  undefined8 uStackY_628;
  undefined8 local_600;
  undefined8 uStackY_5f8;
  undefined8 uStackY_5f0;
  undefined8 uStackY_5e8;
  undefined8 local_5c0;
  undefined8 uStackY_5b8;
  undefined8 uStackY_5b0;
  undefined8 uStackY_5a8;
  undefined8 local_580;
  undefined8 uStackY_578;
  undefined8 uStackY_570;
  undefined8 uStackY_568;
  Lib_IntVector_Intrinsics_vec256 *in_stack_fffffffffffffab0;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  
  memcpy(in_RDI,in_RSI,0x200);
  uVar3 = in_EDX << 3;
  auVar5 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar5 = vpinsrd_avx(auVar5,uVar3,2);
  auVar5 = vpinsrd_avx(auVar5,uVar3,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar4 = vpinsrd_avx(auVar4,uVar3,2);
  auVar4 = vpinsrd_avx(auVar4,uVar3,3);
  auVar4 = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar4;
  auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  uStack_4f0 = auVar5._0_8_;
  uStack_4e8 = auVar5._8_8_;
  auVar2._16_8_ = uStack_4f0;
  auVar2._0_16_ = auVar4;
  auVar2._24_8_ = uStack_4e8;
  auVar1 = vpaddd_avx2(in_RDI[0xc],auVar2);
  in_RDI[0xc] = auVar1;
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  double_round_256(in_stack_fffffffffffffab0);
  auVar1 = vpaddd_avx2(*in_RDI,*in_RSI);
  local_580 = auVar1._0_8_;
  uStackY_578 = auVar1._8_8_;
  uStackY_570 = auVar1._16_8_;
  uStackY_568 = auVar1._24_8_;
  *(undefined8 *)*in_RDI = local_580;
  *(undefined8 *)(*in_RDI + 8) = uStackY_578;
  *(undefined8 *)(*in_RDI + 0x10) = uStackY_570;
  *(undefined8 *)(*in_RDI + 0x18) = uStackY_568;
  auVar1 = vpaddd_avx2(in_RDI[1],in_RSI[1]);
  local_5c0 = auVar1._0_8_;
  uStackY_5b8 = auVar1._8_8_;
  uStackY_5b0 = auVar1._16_8_;
  uStackY_5a8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[1] = local_5c0;
  *(undefined8 *)(in_RDI[1] + 8) = uStackY_5b8;
  *(undefined8 *)(in_RDI[1] + 0x10) = uStackY_5b0;
  *(undefined8 *)(in_RDI[1] + 0x18) = uStackY_5a8;
  auVar1 = vpaddd_avx2(in_RDI[2],in_RSI[2]);
  local_600 = auVar1._0_8_;
  uStackY_5f8 = auVar1._8_8_;
  uStackY_5f0 = auVar1._16_8_;
  uStackY_5e8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[2] = local_600;
  *(undefined8 *)(in_RDI[2] + 8) = uStackY_5f8;
  *(undefined8 *)(in_RDI[2] + 0x10) = uStackY_5f0;
  *(undefined8 *)(in_RDI[2] + 0x18) = uStackY_5e8;
  auVar1 = vpaddd_avx2(in_RDI[3],in_RSI[3]);
  local_640 = auVar1._0_8_;
  uStackY_638 = auVar1._8_8_;
  uStackY_630 = auVar1._16_8_;
  uStackY_628 = auVar1._24_8_;
  *(undefined8 *)in_RDI[3] = local_640;
  *(undefined8 *)(in_RDI[3] + 8) = uStackY_638;
  *(undefined8 *)(in_RDI[3] + 0x10) = uStackY_630;
  *(undefined8 *)(in_RDI[3] + 0x18) = uStackY_628;
  auVar1 = vpaddd_avx2(in_RDI[4],in_RSI[4]);
  local_680 = auVar1._0_8_;
  uStackY_678 = auVar1._8_8_;
  uStackY_670 = auVar1._16_8_;
  uStackY_668 = auVar1._24_8_;
  *(undefined8 *)in_RDI[4] = local_680;
  *(undefined8 *)(in_RDI[4] + 8) = uStackY_678;
  *(undefined8 *)(in_RDI[4] + 0x10) = uStackY_670;
  *(undefined8 *)(in_RDI[4] + 0x18) = uStackY_668;
  auVar1 = vpaddd_avx2(in_RDI[5],in_RSI[5]);
  local_6c0 = auVar1._0_8_;
  uStackY_6b8 = auVar1._8_8_;
  uStackY_6b0 = auVar1._16_8_;
  uStackY_6a8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[5] = local_6c0;
  *(undefined8 *)(in_RDI[5] + 8) = uStackY_6b8;
  *(undefined8 *)(in_RDI[5] + 0x10) = uStackY_6b0;
  *(undefined8 *)(in_RDI[5] + 0x18) = uStackY_6a8;
  auVar1 = vpaddd_avx2(in_RDI[6],in_RSI[6]);
  local_700 = auVar1._0_8_;
  uStackY_6f8 = auVar1._8_8_;
  uStackY_6f0 = auVar1._16_8_;
  uStackY_6e8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[6] = local_700;
  *(undefined8 *)(in_RDI[6] + 8) = uStackY_6f8;
  *(undefined8 *)(in_RDI[6] + 0x10) = uStackY_6f0;
  *(undefined8 *)(in_RDI[6] + 0x18) = uStackY_6e8;
  auVar1 = vpaddd_avx2(in_RDI[7],in_RSI[7]);
  local_740 = auVar1._0_8_;
  uStackY_738 = auVar1._8_8_;
  uStackY_730 = auVar1._16_8_;
  uStackY_728 = auVar1._24_8_;
  *(undefined8 *)in_RDI[7] = local_740;
  *(undefined8 *)(in_RDI[7] + 8) = uStackY_738;
  *(undefined8 *)(in_RDI[7] + 0x10) = uStackY_730;
  *(undefined8 *)(in_RDI[7] + 0x18) = uStackY_728;
  auVar1 = vpaddd_avx2(in_RDI[8],in_RSI[8]);
  local_780 = auVar1._0_8_;
  uStackY_778 = auVar1._8_8_;
  uStackY_770 = auVar1._16_8_;
  uStackY_768 = auVar1._24_8_;
  *(undefined8 *)in_RDI[8] = local_780;
  *(undefined8 *)(in_RDI[8] + 8) = uStackY_778;
  *(undefined8 *)(in_RDI[8] + 0x10) = uStackY_770;
  *(undefined8 *)(in_RDI[8] + 0x18) = uStackY_768;
  auVar1 = vpaddd_avx2(in_RDI[9],in_RSI[9]);
  local_7c0 = auVar1._0_8_;
  uStackY_7b8 = auVar1._8_8_;
  uStackY_7b0 = auVar1._16_8_;
  uStackY_7a8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[9] = local_7c0;
  *(undefined8 *)(in_RDI[9] + 8) = uStackY_7b8;
  *(undefined8 *)(in_RDI[9] + 0x10) = uStackY_7b0;
  *(undefined8 *)(in_RDI[9] + 0x18) = uStackY_7a8;
  auVar1 = vpaddd_avx2(in_RDI[10],in_RSI[10]);
  local_800 = auVar1._0_8_;
  uStackY_7f8 = auVar1._8_8_;
  uStackY_7f0 = auVar1._16_8_;
  uStackY_7e8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[10] = local_800;
  *(undefined8 *)(in_RDI[10] + 8) = uStackY_7f8;
  *(undefined8 *)(in_RDI[10] + 0x10) = uStackY_7f0;
  *(undefined8 *)(in_RDI[10] + 0x18) = uStackY_7e8;
  auVar1 = vpaddd_avx2(in_RDI[0xb],in_RSI[0xb]);
  local_840 = auVar1._0_8_;
  uStackY_838 = auVar1._8_8_;
  uStackY_830 = auVar1._16_8_;
  uStackY_828 = auVar1._24_8_;
  *(undefined8 *)in_RDI[0xb] = local_840;
  *(undefined8 *)(in_RDI[0xb] + 8) = uStackY_838;
  *(undefined8 *)(in_RDI[0xb] + 0x10) = uStackY_830;
  *(undefined8 *)(in_RDI[0xb] + 0x18) = uStackY_828;
  auVar1 = vpaddd_avx2(in_RDI[0xc],in_RSI[0xc]);
  local_880 = auVar1._0_8_;
  uStackY_878 = auVar1._8_8_;
  uStackY_870 = auVar1._16_8_;
  uStackY_868 = auVar1._24_8_;
  *(undefined8 *)in_RDI[0xc] = local_880;
  *(undefined8 *)(in_RDI[0xc] + 8) = uStackY_878;
  *(undefined8 *)(in_RDI[0xc] + 0x10) = uStackY_870;
  *(undefined8 *)(in_RDI[0xc] + 0x18) = uStackY_868;
  auVar1 = vpaddd_avx2(in_RDI[0xd],in_RSI[0xd]);
  local_8c0 = auVar1._0_8_;
  uStackY_8b8 = auVar1._8_8_;
  uStackY_8b0 = auVar1._16_8_;
  uStackY_8a8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[0xd] = local_8c0;
  *(undefined8 *)(in_RDI[0xd] + 8) = uStackY_8b8;
  *(undefined8 *)(in_RDI[0xd] + 0x10) = uStackY_8b0;
  *(undefined8 *)(in_RDI[0xd] + 0x18) = uStackY_8a8;
  auVar1 = vpaddd_avx2(in_RDI[0xe],in_RSI[0xe]);
  local_900 = auVar1._0_8_;
  uStackY_8f8 = auVar1._8_8_;
  uStackY_8f0 = auVar1._16_8_;
  uStackY_8e8 = auVar1._24_8_;
  *(undefined8 *)in_RDI[0xe] = local_900;
  *(undefined8 *)(in_RDI[0xe] + 8) = uStackY_8f8;
  *(undefined8 *)(in_RDI[0xe] + 0x10) = uStackY_8f0;
  *(undefined8 *)(in_RDI[0xe] + 0x18) = uStackY_8e8;
  auVar1 = vpaddd_avx2(in_RDI[0xf],in_RSI[0xf]);
  local_940 = auVar1._0_8_;
  uStackY_938 = auVar1._8_8_;
  uStackY_930 = auVar1._16_8_;
  uStackY_928 = auVar1._24_8_;
  *(undefined8 *)in_RDI[0xf] = local_940;
  *(undefined8 *)(in_RDI[0xf] + 8) = uStackY_938;
  *(undefined8 *)(in_RDI[0xf] + 0x10) = uStackY_930;
  *(undefined8 *)(in_RDI[0xf] + 0x18) = uStackY_928;
  auVar1._16_8_ = uStack_4f0;
  auVar1._0_16_ = auVar4;
  auVar1._24_8_ = uStack_4e8;
  auVar1 = vpaddd_avx2(in_RDI[0xc],auVar1);
  in_RDI[0xc] = auVar1;
  return;
}

Assistant:

static inline void
chacha20_core_256(
  Lib_IntVector_Intrinsics_vec256 *k,
  Lib_IntVector_Intrinsics_vec256 *ctx,
  uint32_t ctr
)
{
  memcpy(k, ctx, 16U * sizeof (Lib_IntVector_Intrinsics_vec256));
  uint32_t ctr_u32 = 8U * ctr;
  Lib_IntVector_Intrinsics_vec256 cv = Lib_IntVector_Intrinsics_vec256_load32(ctr_u32);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  double_round_256(k);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    Lib_IntVector_Intrinsics_vec256 *os = k;
    Lib_IntVector_Intrinsics_vec256 x = Lib_IntVector_Intrinsics_vec256_add32(k[i], ctx[i]);
    os[i] = x;);
  k[12U] = Lib_IntVector_Intrinsics_vec256_add32(k[12U], cv);
}